

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgknd(fitsfile *fptr,char *keyname,int nstart,int nmax,double *value,int *nfound,int *status)

{
  char *__src;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long ival;
  int tstatus;
  int nkeys;
  int *local_198;
  double *local_190;
  int mkeys;
  char keyindex [8];
  char keyroot [75];
  char svalue [71];
  char comm [73];
  char card [81];
  
  iVar10 = *status;
  if (iVar10 < 1) {
    *nfound = 0;
    keyroot[0] = '\0';
    local_190 = value;
    strncat(keyroot,keyname,0x4a);
    sVar3 = strlen(keyroot);
    iVar10 = (int)sVar3;
    if (iVar10 == 0) {
LAB_00163961:
      iVar10 = *status;
    }
    else {
      uVar9 = 0;
      uVar8 = 0;
      local_198 = nfound;
      if (0 < iVar10) {
        uVar8 = sVar3 & 0xffffffff;
      }
      for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        pp_Var4 = __ctype_toupper_loc();
        keyroot[uVar9] = (char)(*pp_Var4)[keyroot[uVar9]];
      }
      ffghps(fptr,&nkeys,&mkeys,status);
      ffmaky(fptr,3,status);
      __src = card + iVar10;
      lVar6 = (long)nstart;
      bVar1 = false;
      for (iVar7 = 3; iVar7 <= nkeys; iVar7 = iVar7 + 1) {
        iVar2 = ffgnky(fptr,card,status);
        if (0 < iVar2) goto LAB_00163961;
        iVar2 = strncmp(keyroot,card,(long)iVar10);
        if (iVar2 == 0) {
          keyindex[0] = '\0';
          pcVar5 = strchr(card,0x3d);
          if (pcVar5 != (char *)0x0) {
            sVar3 = (long)pcVar5 - (long)__src;
            if (7 < (long)sVar3) {
              *status = 0xcf;
              return 0xcf;
            }
            strncat(keyindex,__src,sVar3);
            tstatus = 0;
            iVar2 = ffc2ii(keyindex,&ival,&tstatus);
            if ((iVar2 < 1) && (lVar6 <= ival && ival <= nstart + nmax + -1)) {
              ffpsvc(card,svalue,comm,status);
              ffc2d(svalue,local_190 + (ival - lVar6),status);
              if ((long)*local_198 <= ival - lVar6) {
                *local_198 = (int)(ival - lVar6) + 1;
              }
              if (*status == 0xcc) {
                *status = 0;
                bVar1 = true;
              }
            }
          }
        }
      }
      iVar10 = *status;
      if (iVar10 < 1 && bVar1) {
        *status = 0xcc;
        iVar10 = 0xcc;
      }
    }
  }
  return iVar10;
}

Assistant:

int ffgknd( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyname,      /* I - root name of keywords to read        */
            int  nstart,        /* I - starting index number                */
            int  nmax,          /* I - maximum number of keywords to return */
            double *value,      /* O - array of keyword values              */
            int  *nfound,       /* O - number of values that were returned  */
            int  *status)       /* IO - error status                        */
/*
  Read (get) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NMAX -1) inclusive.  
*/
{
    int nend, lenroot, ii, nkeys, mkeys, tstatus, undefinedval;
    long ival;
    char keyroot[FLEN_KEYWORD], keyindex[8], card[FLEN_CARD];
    char svalue[FLEN_VALUE], comm[FLEN_COMMENT], *equalssign;

    if (*status > 0)
        return(*status);

    *nfound = 0;
    nend = nstart + nmax - 1;

    keyroot[0] = '\0';
    strncat(keyroot, keyname, FLEN_KEYWORD - 1);

    lenroot = strlen(keyroot);

    if (lenroot == 0)     /*  root must be at least 1 char long  */
        return(*status);

    for (ii=0; ii < lenroot; ii++)           /*  make sure upper case  */
        keyroot[ii] = toupper(keyroot[ii]);

    ffghps(fptr, &nkeys, &mkeys, status);  /*  get the number of keywords  */

    ffmaky(fptr, 3, status);  /* move to 3rd keyword (skip 1st 2 keywords) */

    undefinedval = FALSE;
    for (ii=3; ii <= nkeys; ii++)  
    {
       if (ffgnky(fptr, card, status) > 0)     /*  get next keyword  */
           return(*status);
       if (strncmp(keyroot, card, lenroot) == 0)   /* see if keyword matches */
       {
          keyindex[0] = '\0';
          equalssign = strchr(card, '=');
	  if (equalssign == 0) continue;  /* keyword has no value */

          if (equalssign - card - lenroot > 7)
          {
             return (*status=BAD_KEYCHAR);
          }
          strncat(keyindex, &card[lenroot], equalssign - card  - lenroot);  /*  copy suffix  */
          tstatus = 0;
          if (ffc2ii(keyindex, &ival, &tstatus) <= 0)      /*  test suffix */
          {
             if (ival <= nend && ival >= nstart) /* is index within range? */
             {
                ffpsvc(card, svalue, comm, status);   /*  parse the value */
                ffc2d(svalue, &value[ival-nstart], status); /* convert */
                if (ival - nstart + 1 > *nfound)
                      *nfound = ival - nstart + 1;  /*  max found */ 

                if (*status == VALUE_UNDEFINED)
                {
                    undefinedval = TRUE;
                   *status = 0;  /* reset status to read remaining values */
                }
             }
          }
       }
    }
    if (undefinedval && (*status <= 0) )
        *status = VALUE_UNDEFINED;  /* report at least 1 value undefined */

    return(*status);
}